

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O1

int root_close(int handle)

{
  int sock;
  
  sock = handleTable[handle].sock;
  root_send_buffer(sock,0x7d8,(char *)0x0,0);
  close(sock);
  handleTable[handle].sock = 0;
  return 0;
}

Assistant:

int root_close(int handle)
/*
  close the file
*/
{

  int status;
  int sock;

  sock = handleTable[handle].sock;
  status = root_send_buffer(sock,ROOTD_CLOSE,NULL,0);
  close(sock);
  handleTable[handle].sock = 0;
  return(0);
}